

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_Thing_Move(int tid,AActor *source,int mapspot,bool fog)

{
  bool bVar1;
  AActor *pAVar2;
  FActorIterator iterator1;
  FActorIterator iterator2;
  DVector3 local_48;
  FActorIterator local_28;
  
  if (tid != 0) {
    local_48.X = 0.0;
    local_48.Y = (double)CONCAT44(local_48.Y._4_4_,tid);
    source = FActorIterator::Next((FActorIterator *)&local_48);
  }
  local_28.base = (AActor *)0x0;
  local_28.id = mapspot;
  pAVar2 = FActorIterator::Next(&local_28);
  if (pAVar2 == (AActor *)0x0 || source == (AActor *)0x0) {
    bVar1 = false;
  }
  else {
    local_48.X = (pAVar2->__Pos).X;
    local_48.Y = (pAVar2->__Pos).Y;
    local_48.Z = (pAVar2->__Pos).Z;
    bVar1 = P_MoveThing(source,&local_48,fog);
  }
  return bVar1;
}

Assistant:

bool P_Thing_Move (int tid, AActor *source, int mapspot, bool fog)
{
	AActor *target;

	if (tid != 0)
	{
		FActorIterator iterator1(tid);
		source = iterator1.Next();
	}
	FActorIterator iterator2 (mapspot);
	target = iterator2.Next ();

	if (source != NULL && target != NULL)
	{
		return P_MoveThing(source, target->Pos(), fog);
	}
	return false;
}